

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pDrawCallBatchingTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Performance::anon_unknown_0::DrawCallBatchingTest::init
          (DrawCallBatchingTest *this,EVP_PKEY_CTX *ctx)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  uint uVar2;
  int iVar3;
  RenderContext *renderCtx;
  bool bVar4;
  deUint32 dVar5;
  GLuint GVar6;
  ostream *poVar7;
  ShaderProgram *this_00;
  ProgramSources *pPVar8;
  reference pvVar9;
  ulong uVar10;
  reference pvVar11;
  undefined4 extraout_var_00;
  TestError *this_01;
  ostringstream oVar12;
  int attributeNdx;
  int iVar13;
  int iVar14;
  long lVar15;
  char *pcVar16;
  size_type sVar17;
  int triangleNdx;
  char cVar18;
  int i_1;
  long lVar19;
  byte bVar20;
  ostringstream oVar21;
  int i_3;
  string local_488;
  string local_468;
  ostringstream vertexShader;
  undefined7 uStack_447;
  undefined1 local_2c8 [40];
  undefined1 local_2a0 [40];
  ostringstream fragmentShader;
  undefined3 uStack_277;
  ProgramSources local_100;
  undefined4 extraout_var;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vertexShader);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fragmentShader);
  for (iVar13 = 0; iVar14 = (this->m_spec).staticAttributeCount, iVar13 < iVar14;
      iVar13 = iVar13 + 1) {
    poVar7 = std::operator<<((ostream *)&vertexShader,"attribute mediump vec4 a_static");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar13);
    std::operator<<(poVar7,";\n");
  }
  if ((0 < iVar14) && (0 < (this->m_spec).dynamicAttributeCount)) {
    std::operator<<((ostream *)&vertexShader,"\n");
  }
  for (iVar13 = 0; iVar13 < (this->m_spec).dynamicAttributeCount; iVar13 = iVar13 + 1) {
    poVar7 = std::operator<<((ostream *)&vertexShader,"attribute mediump vec4 a_dyn");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar13);
    std::operator<<(poVar7,";\n");
  }
  poVar7 = std::operator<<((ostream *)&vertexShader,"\n");
  poVar7 = std::operator<<(poVar7,"varying mediump vec4 v_color;\n");
  poVar7 = std::operator<<(poVar7,"\n");
  poVar7 = std::operator<<(poVar7,"void main (void)\n");
  std::operator<<(poVar7,"{\n");
  std::operator<<((ostream *)&vertexShader,"\tv_color = ");
  bVar4 = true;
  for (iVar13 = 0; iVar13 < (this->m_spec).staticAttributeCount; iVar13 = iVar13 + 1) {
    if (!bVar4) {
      std::operator<<((ostream *)&vertexShader," + ");
    }
    poVar7 = std::operator<<((ostream *)&vertexShader,"a_static");
    std::ostream::operator<<(poVar7,iVar13);
    bVar4 = false;
  }
  for (iVar13 = 0; iVar13 < (this->m_spec).dynamicAttributeCount; iVar13 = iVar13 + 1) {
    if (!bVar4) {
      std::operator<<((ostream *)&vertexShader," + ");
    }
    poVar7 = std::operator<<((ostream *)&vertexShader,"a_dyn");
    std::ostream::operator<<(poVar7,iVar13);
    bVar4 = false;
  }
  std::operator<<((ostream *)&vertexShader,";\n");
  pcVar16 = "\tgl_Position = a_static0;\n";
  if (0 < (this->m_spec).dynamicAttributeCount) {
    pcVar16 = "\tgl_Position = a_dyn0;\n";
  }
  std::operator<<((ostream *)&vertexShader,pcVar16);
  std::operator<<((ostream *)&vertexShader,"}");
  poVar7 = std::operator<<((ostream *)&fragmentShader,"varying mediump vec4 v_color;\n");
  poVar7 = std::operator<<(poVar7,"\n");
  poVar7 = std::operator<<(poVar7,"void main(void)\n");
  poVar7 = std::operator<<(poVar7,"{\n");
  poVar7 = std::operator<<(poVar7,"\tgl_FragColor = v_color;\n");
  std::operator<<(poVar7,"}\n");
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = this->m_renderCtx;
  memset(&local_100,0,0xac);
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)local_2a0,&local_468);
  pPVar8 = glu::ProgramSources::operator<<(&local_100,(ShaderSource *)local_2a0);
  std::__cxx11::stringbuf::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)local_2c8,&local_488);
  pPVar8 = glu::ProgramSources::operator<<(pPVar8,(ShaderSource *)local_2c8);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,pPVar8);
  this->m_program = this_00;
  std::__cxx11::string::~string((string *)(local_2c8 + 8));
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)(local_2a0 + 8));
  std::__cxx11::string::~string((string *)&local_468);
  glu::ProgramSources::~ProgramSources(&local_100);
  glu::operator<<(((this->super_TestCase).super_TestNode.m_testCtx)->m_log,this->m_program);
  if ((this->m_program->m_program).m_info.linkOk != false) {
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fragmentShader);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vertexShader);
    for (iVar13 = 0; iVar13 < (this->m_spec).staticAttributeCount; iVar13 = iVar13 + 1) {
      _vertexShader = 0;
      sVar17 = (size_type)((this->m_spec).triangleCount * (this->m_spec).drawCallCount * 0xc);
      if ((this->m_spec).dynamicAttributeCount == 0 && iVar13 == 0) {
        std::vector<signed_char,_std::allocator<signed_char>_>::reserve
                  ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,sVar17);
        iVar14 = 0;
        while( true ) {
          uVar2 = (this->m_spec).triangleCount;
          if ((int)((this->m_spec).drawCallCount * uVar2) <= iVar14) break;
          bVar20 = -((uVar2 & 0x80000001) != 1 & (byte)iVar14) | 1;
          oVar12 = (ostringstream)(bVar20 * -0x7f);
          fragmentShader = oVar12;
          std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                    ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,
                     (char *)&fragmentShader);
          fragmentShader = oVar12;
          std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                    ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,
                     (char *)&fragmentShader);
          fragmentShader = (ostringstream)0x0;
          std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                    ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,
                     (char *)&fragmentShader);
          fragmentShader = (ostringstream)0x7f;
          std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                    ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,
                     (char *)&fragmentShader);
          oVar21 = (ostringstream)(bVar20 * '\x7f');
          fragmentShader = oVar21;
          std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                    ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,
                     (char *)&fragmentShader);
          fragmentShader = oVar12;
          std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                    ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,
                     (char *)&fragmentShader);
          fragmentShader = (ostringstream)0x0;
          std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                    ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,
                     (char *)&fragmentShader);
          fragmentShader = (ostringstream)0x7f;
          std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                    ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,
                     (char *)&fragmentShader);
          fragmentShader = oVar21;
          std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                    ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,
                     (char *)&fragmentShader);
          fragmentShader = oVar21;
          std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                    ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,
                     (char *)&fragmentShader);
          fragmentShader = (ostringstream)0x0;
          std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                    ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,
                     (char *)&fragmentShader);
          _fragmentShader = CONCAT31(uStack_277,0x7f);
          std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                    ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,
                     (char *)&fragmentShader);
          iVar14 = iVar14 + 1;
        }
      }
      else {
        std::vector<signed_char,_std::allocator<signed_char>_>::reserve
                  ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,sVar17);
        for (iVar14 = 0; iVar14 < (this->m_spec).triangleCount * (this->m_spec).drawCallCount * 0xc;
            iVar14 = iVar14 + 1) {
          dVar5 = deRandom_getUint32(&(this->m_rnd).m_rnd);
          _fragmentShader = CONCAT31(uStack_277,(char)dVar5);
          std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                    ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,
                     (char *)&fragmentShader);
        }
      }
      std::
      vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
      ::push_back(&this->m_staticAttributeDatas,(value_type *)&vertexShader);
      std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
                ((_Vector_base<signed_char,_std::allocator<signed_char>_> *)&vertexShader);
    }
    for (iVar13 = 0; iVar13 < (this->m_spec).dynamicAttributeCount; iVar13 = iVar13 + 1) {
      _vertexShader = 0;
      sVar17 = (size_type)((this->m_spec).triangleCount * (this->m_spec).drawCallCount * 0xc);
      if (iVar13 == 0) {
        std::vector<signed_char,_std::allocator<signed_char>_>::reserve
                  ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,sVar17);
        for (iVar14 = 0; iVar14 < (this->m_spec).drawCallCount * (this->m_spec).triangleCount;
            iVar14 = iVar14 + 1) {
          bVar20 = -((byte)iVar14 & 1) | 1;
          oVar12 = (ostringstream)(bVar20 * -0x7f);
          fragmentShader = oVar12;
          std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                    ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,
                     (char *)&fragmentShader);
          fragmentShader = oVar12;
          std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                    ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,
                     (char *)&fragmentShader);
          fragmentShader = (ostringstream)0x0;
          std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                    ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,
                     (char *)&fragmentShader);
          fragmentShader = (ostringstream)0x7f;
          std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                    ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,
                     (char *)&fragmentShader);
          oVar21 = (ostringstream)(bVar20 * '\x7f');
          fragmentShader = oVar21;
          std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                    ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,
                     (char *)&fragmentShader);
          fragmentShader = oVar12;
          std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                    ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,
                     (char *)&fragmentShader);
          fragmentShader = (ostringstream)0x0;
          std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                    ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,
                     (char *)&fragmentShader);
          fragmentShader = (ostringstream)0x7f;
          std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                    ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,
                     (char *)&fragmentShader);
          fragmentShader = oVar21;
          std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                    ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,
                     (char *)&fragmentShader);
          fragmentShader = oVar21;
          std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                    ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,
                     (char *)&fragmentShader);
          fragmentShader = (ostringstream)0x0;
          std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                    ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,
                     (char *)&fragmentShader);
          _fragmentShader = CONCAT31(uStack_277,0x7f);
          std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                    ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,
                     (char *)&fragmentShader);
        }
      }
      else {
        std::vector<signed_char,_std::allocator<signed_char>_>::reserve
                  ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,sVar17);
        for (iVar14 = 0; iVar14 < (this->m_spec).triangleCount * (this->m_spec).drawCallCount * 0xc;
            iVar14 = iVar14 + 1) {
          dVar5 = deRandom_getUint32(&(this->m_rnd).m_rnd);
          _fragmentShader = CONCAT31(uStack_277,(char)dVar5);
          std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                    ((vector<signed_char,_std::allocator<signed_char>_> *)&vertexShader,
                     (char *)&fragmentShader);
        }
      }
      std::
      vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
      ::push_back(&this->m_dynamicAttributeDatas,(value_type *)&vertexShader);
      std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
                ((_Vector_base<signed_char,_std::allocator<signed_char>_> *)&vertexShader);
    }
    iVar13 = (*this->m_renderCtx->_vptr_RenderContext[3])();
    pvVar9 = (reference)CONCAT44(extraout_var,iVar13);
    pvVar11 = pvVar9;
    if ((this->m_spec).useStaticBuffer == true) {
      lVar19 = 0;
      for (lVar15 = 0; uVar10 = (ulong)(this->m_spec).staticAttributeCount, lVar15 < (long)uVar10;
          lVar15 = lVar15 + 1) {
        (**(code **)(pvVar9 + 0x6c8))(1,&vertexShader);
        (**(code **)(pvVar9 + 0x40))(0x8892,_vertexShader & 0xffffffff);
        (**(code **)(pvVar9 + 0x150))
                  (0x8892,(long)((this->m_spec).triangleCount * (this->m_spec).drawCallCount * 0xc),
                   *(undefined8 *)
                    ((long)&(((this->m_staticAttributeDatas).
                              super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                            super__Vector_impl_data._M_start + lVar19),0x88e4);
        (**(code **)(pvVar9 + 0x40))(0x8892,0);
        dVar5 = (**(code **)(pvVar9 + 0x800))();
        glu::checkError(dVar5,"Creating static buffer failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                        ,0x16b);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->m_batchedStaticBuffers,(value_type_conflict2 *)&vertexShader);
        lVar19 = lVar19 + 0x18;
      }
      lVar19 = 0;
      for (lVar15 = 0; pvVar11 = (reference)(long)(int)uVar10, lVar15 < (long)pvVar11;
          lVar15 = lVar15 + 1) {
        (**(code **)(pvVar9 + 0x6c8))(1,&vertexShader);
        (**(code **)(pvVar9 + 0x40))(0x8892,_vertexShader & 0xffffffff);
        (**(code **)(pvVar9 + 0x150))
                  (0x8892,(long)((this->m_spec).triangleCount * 0xc),
                   *(undefined8 *)
                    ((long)&(((this->m_staticAttributeDatas).
                              super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                            super__Vector_impl_data._M_start + lVar19),0x88e4);
        (**(code **)(pvVar9 + 0x40))(0x8892,0);
        dVar5 = (**(code **)(pvVar9 + 0x800))();
        glu::checkError(dVar5,"Creating static buffer failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                        ,0x179);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->m_unbatchedStaticBuffers,(value_type_conflict2 *)&vertexShader);
        uVar10 = (ulong)(uint)(this->m_spec).staticAttributeCount;
        lVar19 = lVar19 + 0x18;
      }
    }
    if ((this->m_spec).useDynamicBuffer == true) {
      lVar19 = 0;
      for (lVar15 = 0; uVar10 = (ulong)(this->m_spec).dynamicAttributeCount, lVar15 < (long)uVar10;
          lVar15 = lVar15 + 1) {
        (**(code **)(pvVar9 + 0x6c8))(1,&vertexShader);
        (**(code **)(pvVar9 + 0x40))(0x8892,_vertexShader & 0xffffffff);
        (**(code **)(pvVar9 + 0x150))
                  (0x8892,(long)((this->m_spec).triangleCount * (this->m_spec).drawCallCount * 0xc),
                   *(undefined8 *)
                    ((long)&(((this->m_dynamicAttributeDatas).
                              super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                            super__Vector_impl_data._M_start + lVar19),0x88e4);
        (**(code **)(pvVar9 + 0x40))(0x8892,0);
        dVar5 = (**(code **)(pvVar9 + 0x800))();
        glu::checkError(dVar5,"Creating dynamic buffer failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                        ,0x18a);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->m_batchedDynamicBuffers,(value_type_conflict2 *)&vertexShader);
        lVar19 = lVar19 + 0x18;
      }
      for (lVar15 = 0; pvVar11 = (reference)(long)(int)uVar10, lVar15 < (long)pvVar11;
          lVar15 = lVar15 + 1) {
        _vertexShader = 0;
        for (iVar13 = 0; iVar13 < (this->m_spec).drawCallCount; iVar13 = iVar13 + 1) {
          (**(code **)(pvVar9 + 0x6c8))(1,&fragmentShader);
          (**(code **)(pvVar9 + 0x40))(0x8892,_fragmentShader);
          (**(code **)(pvVar9 + 0x150))
                    (0x8892,(long)((this->m_spec).triangleCount * (this->m_spec).drawCallCount * 0xc
                                  ),
                     (this->m_dynamicAttributeDatas).
                     super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar15].
                     super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                     super__Vector_impl_data._M_start,0x88e4);
          (**(code **)(pvVar9 + 0x40))(0x8892,0);
          dVar5 = (**(code **)(pvVar9 + 0x800))();
          glu::checkError(dVar5,"Creating dynamic buffer failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                          ,0x19c);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vertexShader,
                     (value_type_conflict2 *)&fragmentShader);
        }
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::push_back(&this->m_unbatchedDynamicBuffers,(value_type *)&vertexShader);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&vertexShader);
        uVar10 = (ulong)(uint)(this->m_spec).dynamicAttributeCount;
      }
    }
    GVar6 = (GLuint)pvVar11;
    if ((this->m_spec).useDrawElements == true) {
      if ((this->m_spec).dynamicIndices == false) {
        pvVar1 = &this->m_staticIndexData;
        for (iVar13 = 0; GVar6 = (GLuint)pvVar11, iVar13 < (this->m_spec).drawCallCount;
            iVar13 = iVar13 + 1) {
          cVar18 = '\x02';
          for (iVar14 = 0; iVar14 < (this->m_spec).triangleCount; iVar14 = iVar14 + 1) {
            vertexShader = (ostringstream)(cVar18 + -2);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      (pvVar1,(uchar *)&vertexShader);
            vertexShader = (ostringstream)(cVar18 + -1);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      (pvVar1,(uchar *)&vertexShader);
            _vertexShader = CONCAT71(uStack_447,cVar18);
            pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                      emplace_back<unsigned_char>(pvVar1,(uchar *)&vertexShader);
            cVar18 = cVar18 + '\x03';
          }
        }
      }
      else {
        pvVar1 = &this->m_dynamicIndexData;
        for (iVar13 = 0; GVar6 = (GLuint)pvVar11, iVar13 < (this->m_spec).drawCallCount;
            iVar13 = iVar13 + 1) {
          cVar18 = '\x02';
          for (iVar14 = 0; iVar14 < (this->m_spec).triangleCount; iVar14 = iVar14 + 1) {
            vertexShader = (ostringstream)(cVar18 + -2);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      (pvVar1,(uchar *)&vertexShader);
            vertexShader = (ostringstream)(cVar18 + -1);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      (pvVar1,(uchar *)&vertexShader);
            _vertexShader = CONCAT71(uStack_447,cVar18);
            pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                      emplace_back<unsigned_char>(pvVar1,(uchar *)&vertexShader);
            cVar18 = cVar18 + '\x03';
          }
        }
      }
      if ((this->m_spec).useIndexBuffer == true) {
        iVar13 = (*this->m_renderCtx->_vptr_RenderContext[3])();
        lVar15 = CONCAT44(extraout_var_00,iVar13);
        if ((this->m_spec).dynamicIndices == true) {
          iVar14 = 0;
          for (iVar13 = 0; iVar13 < (this->m_spec).drawCallCount; iVar13 = iVar13 + 1) {
            (**(code **)(lVar15 + 0x6c8))(1,&vertexShader);
            (**(code **)(lVar15 + 0x40))(0x8893,_vertexShader & 0xffffffff);
            iVar3 = (this->m_spec).triangleCount;
            (**(code **)(lVar15 + 0x150))
                      (0x8893,(long)(iVar3 * 3),
                       (this->m_dynamicIndexData).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + iVar3 * iVar14,0x88e4);
            (**(code **)(lVar15 + 0x40))(0x8893,0);
            dVar5 = (**(code **)(lVar15 + 0x800))();
            glu::checkError(dVar5,"Creating dynamic index buffer failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                            ,0x1b4);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (&this->m_unbatchedDynamicIndexBuffers,(value_type_conflict2 *)&vertexShader);
            iVar14 = iVar14 + 3;
          }
          (**(code **)(lVar15 + 0x6c8))(1,&vertexShader);
          (**(code **)(lVar15 + 0x40))(0x8893,_vertexShader & 0xffffffff);
          (**(code **)(lVar15 + 0x150))
                    (0x8893,(long)((this->m_spec).triangleCount * (this->m_spec).drawCallCount * 3),
                     (this->m_dynamicIndexData).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,0x88e4);
          (**(code **)(lVar15 + 0x40))(0x8893,0);
          dVar5 = (**(code **)(lVar15 + 0x800))();
          glu::checkError(dVar5,"Creating dynamic index buffer failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                          ,0x1c0);
          this->m_batchedDynamicIndexBuffer = _vertexShader;
          GVar6 = _vertexShader;
        }
        else {
          (**(code **)(lVar15 + 0x6c8))(1,&vertexShader);
          (**(code **)(lVar15 + 0x40))(0x8893,_vertexShader & 0xffffffff);
          (**(code **)(lVar15 + 0x150))
                    (0x8893,(long)((this->m_spec).triangleCount * (this->m_spec).drawCallCount * 3),
                     (this->m_staticIndexData).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,0x88e4);
          (**(code **)(lVar15 + 0x40))(0x8893,0);
          dVar5 = (**(code **)(lVar15 + 0x800))();
          glu::checkError(dVar5,"Creating dynamic index buffer failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                          ,0x1ce);
          this->m_batchedStaticIndexBuffer = _vertexShader;
          (**(code **)(lVar15 + 0x6c8))(1,&vertexShader);
          (**(code **)(lVar15 + 0x40))(0x8893,_vertexShader & 0xffffffff);
          (**(code **)(lVar15 + 0x150))
                    (0x8893,(long)((this->m_spec).triangleCount * 3),
                     (this->m_staticIndexData).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,0x88e4);
          (**(code **)(lVar15 + 0x40))(0x8893,0);
          dVar5 = (**(code **)(lVar15 + 0x800))();
          glu::checkError(dVar5,"Creating dynamic index buffer failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                          ,0x1da);
          this->m_unbatchedStaticIndexBuffer = _vertexShader;
          GVar6 = _vertexShader;
        }
      }
    }
    return GVar6;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,(char *)0x0,"m_program->isOk()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
             ,0x106);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void DrawCallBatchingTest::init (void)
{
	createShader();
	createAttributeDatas();
	createArrayBuffers();

	if (m_spec.useDrawElements)
	{
		createIndexData();

		if (m_spec.useIndexBuffer)
			createIndexBuffer();
	}
}